

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

ostream * deqp::ub::operator<<(ostream *stream,BlockLayoutEntry *entry)

{
  bool bVar1;
  ostream *poVar2;
  reference piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  const_iterator i;
  BlockLayoutEntry *entry_local;
  ostream *stream_local;
  
  i._M_current = (int *)entry;
  poVar2 = std::operator<<(stream,(string *)entry);
  poVar2 = std::operator<<(poVar2," { name = ");
  poVar2 = std::operator<<(poVar2,(string *)i._M_current);
  poVar2 = std::operator<<(poVar2,", size = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,i._M_current[8]);
  std::operator<<(poVar2,", activeUniformIndices = [");
  local_20._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)(i._M_current + 10));
  while( true ) {
    local_28._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)(i._M_current + 10));
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)(i._M_current + 10));
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (bVar1) {
      std::operator<<(stream,", ");
    }
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_20);
    std::ostream::operator<<(stream,*piVar3);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20,0);
  }
  std::operator<<(stream,"] }");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const BlockLayoutEntry& entry)
{
	stream << entry.name << " { name = " << entry.name << ", size = " << entry.size << ", activeUniformIndices = [";

	for (vector<int>::const_iterator i = entry.activeUniformIndices.begin(); i != entry.activeUniformIndices.end(); i++)
	{
		if (i != entry.activeUniformIndices.begin())
			stream << ", ";
		stream << *i;
	}

	stream << "] }";
	return stream;
}